

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLString.hpp
# Opt level: O3

bool xercesc_4_0::XMLString::equals(XMLCh *str1,XMLCh *str2)

{
  XMLCh XVar1;
  XMLCh XVar2;
  
  if (str1 == str2) {
    return true;
  }
  if (str2 == (XMLCh *)0x0 || str1 == (XMLCh *)0x0) {
    if (str1 == (XMLCh *)0x0) {
      if (str2 == (XMLCh *)0x0) {
        return true;
      }
    }
    else if (*str1 != L'\0' || str2 == (XMLCh *)0x0) {
      return *str1 == L'\0';
    }
  }
  else {
    while (XVar1 = *str1, XVar1 != L'\0') {
      str1 = str1 + 1;
      XVar2 = *str2;
      str2 = str2 + 1;
      if (XVar1 != XVar2) {
        return false;
      }
    }
  }
  return *str2 == L'\0';
}

Assistant:

inline bool XMLString::equals(   const XMLCh* str1
                               , const XMLCh* str2)
{
    if (str1 == str2)
        return true;

    if (str1 == 0 || str2 == 0)
        return ((!str1 || !*str1) && (!str2 || !*str2));

    while (*str1)
        if(*str1++ != *str2++)  // they are different (or str2 is shorter and we hit the NULL)
            return false;

    // either both ended (and *str2 is 0 too), or str2 is longer
    return (*str2==0);
}